

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O3

void __thiscall
zmq::socks_response_t::socks_response_t
          (socks_response_t *this,uint8_t response_code_,string *address_,uint16_t port_)

{
  pointer pcVar1;
  
  this->response_code = response_code_;
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  pcVar1 = (address_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->address,pcVar1,pcVar1 + address_->_M_string_length);
  this->port = port_;
  return;
}

Assistant:

zmq::socks_response_t::socks_response_t (uint8_t response_code_,
                                         const std::string &address_,
                                         uint16_t port_) :
    response_code (response_code_),
    address (address_),
    port (port_)
{
}